

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::SerializeFloat(IMkvWriter *writer,float f)

{
  int iVar1;
  undefined1 local_2d;
  int32 status;
  int iStack_28;
  uint8 byte;
  int32 bit_count;
  int32 byte_count;
  int32 i;
  U32 value;
  float f_local;
  IMkvWriter *writer_local;
  
  if (writer == (IMkvWriter *)0x0) {
    writer_local._4_4_ = -1;
  }
  else {
    byte_count = (int32)f;
    i = (int32)f;
    _value = writer;
    for (bit_count = 1; bit_count < 5; bit_count = bit_count + 1) {
      iStack_28 = 4 - bit_count;
      status = iStack_28 * 8;
      local_2d = (undefined1)((uint)byte_count >> ((byte)status & 0x1f));
      iVar1 = (**_value->_vptr_IMkvWriter)(_value,&local_2d,1);
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    writer_local._4_4_ = 0;
  }
  return writer_local._4_4_;
}

Assistant:

int32 SerializeFloat(IMkvWriter* writer, float f) {
  if (!writer)
    return -1;

  assert(sizeof(uint32) == sizeof(float));
  // This union is merely used to avoid a reinterpret_cast from float& to
  // uint32& which will result in violation of strict aliasing.
  union U32 {
    uint32 u32;
    float f;
  } value;
  value.f = f;

  for (int32 i = 1; i <= 4; ++i) {
    const int32 byte_count = 4 - i;
    const int32 bit_count = byte_count * 8;

    const uint8 byte = static_cast<uint8>(value.u32 >> bit_count);

    const int32 status = writer->Write(&byte, 1);

    if (status < 0)
      return status;
  }

  return 0;
}